

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O2

int N_VConstrMask_Serial(N_Vector c,N_Vector x,N_Vector m)

{
  double dVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  double dVar7;
  
  lVar5 = *x->content;
  lVar2 = *(long *)((long)x->content + 0x10);
  lVar3 = *(long *)((long)c->content + 0x10);
  lVar6 = 0;
  if (lVar5 < 1) {
    lVar5 = lVar6;
  }
  lVar4 = *(long *)((long)m->content + 0x10);
  dVar7 = 0.0;
  for (; lVar5 != lVar6; lVar6 = lVar6 + 1) {
    *(undefined8 *)(lVar4 + lVar6 * 8) = 0;
    dVar1 = *(double *)(lVar3 + lVar6 * 8);
    if (((dVar1 != 0.0) || (NAN(dVar1))) &&
       (((1.5 < ABS(dVar1) && (*(double *)(lVar2 + lVar6 * 8) * dVar1 <= 0.0)) ||
        ((0.5 < ABS(dVar1) && (dVar1 * *(double *)(lVar2 + lVar6 * 8) < 0.0)))))) {
      *(undefined8 *)(lVar4 + lVar6 * 8) = 0x3ff0000000000000;
      dVar7 = 1.0;
    }
  }
  return -(uint)(dVar7 != 1.0) & 1;
}

Assistant:

sunbooleantype N_VConstrMask_Serial(N_Vector c, N_Vector x, N_Vector m)
{
  sunindextype i, N;
  sunrealtype temp;
  sunrealtype *cd, *xd, *md;
  sunbooleantype test;

  cd = xd = md = NULL;

  N  = NV_LENGTH_S(x);
  xd = NV_DATA_S(x);
  cd = NV_DATA_S(c);
  md = NV_DATA_S(m);

  temp = ZERO;

  for (i = 0; i < N; i++)
  {
    md[i] = ZERO;

    /* Continue if no constraints were set for the variable */
    if (cd[i] == ZERO) { continue; }

    /* Check if a set constraint has been violated */
    test = (SUNRabs(cd[i]) > ONEPT5 && xd[i] * cd[i] <= ZERO) ||
           (SUNRabs(cd[i]) > HALF && xd[i] * cd[i] < ZERO);
    if (test) { temp = md[i] = ONE; }
  }

  /* Return false if any constraint was violated */
  return (temp == ONE) ? SUNFALSE : SUNTRUE;
}